

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::BlockEnd(w3Interp *this)

{
  pointer pwVar1;
  Value VVar2;
  w3Frame *pwVar3;
  size_t sVar4;
  w3Tag wVar5;
  undefined7 uVar6;
  w3Tag wVar7;
  undefined7 uVar8;
  ulong uVar9;
  undefined8 extraout_RAX;
  pointer pwVar10;
  long lVar11;
  ulong uVar12;
  string sStack_28;
  
  pwVar10 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
            super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  pwVar1 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = ((long)pwVar1 - (long)pwVar10) / 0x30;
  if (pwVar1 == pwVar10) {
    StringFormat_abi_cxx11_(&sStack_28,"%lX",0);
    AssertFailedFormat("s > 0",&sStack_28);
    std::__cxx11::string::~string((string *)&sStack_28);
    _Unwind_Resume(extraout_RAX);
  }
  pwVar10 = pwVar10 + uVar9;
  lVar11 = -uVar9;
  do {
    lVar11 = lVar11 + 1;
    if (lVar11 == 1) {
LAB_0011b661:
      AssertFailed("j > 0 && (p [j - 1].tag == Tag_Label || p [j - 1].tag == Tag_Frame)");
    }
    if (pwVar10[-1].tag != Tag_Value) {
      if ((byte)(pwVar10[-1].tag + Tag_i32) < 2) {
        for (uVar12 = -lVar11; uVar12 < uVar9; uVar12 = uVar12 + 1) {
          wVar5 = pwVar10->tag;
          uVar6 = *(undefined7 *)&pwVar10->field_0x1;
          wVar7 = (pwVar10->value).tag;
          uVar8 = *(undefined7 *)&(pwVar10->value).field_0x1;
          VVar2 = (pwVar10->value).value;
          pwVar3 = pwVar10->frame;
          sVar4 = (pwVar10->label).continuation;
          pwVar10[-1].label.arity = (pwVar10->label).arity;
          pwVar10[-1].label.continuation = sVar4;
          pwVar10[-1].value.value = VVar2;
          pwVar10[-1].frame = pwVar3;
          pwVar10[-1].tag = wVar5;
          *(undefined7 *)&pwVar10[-1].field_0x1 = uVar6;
          pwVar10[-1].value.tag = wVar7;
          *(undefined7 *)&pwVar10[-1].value.field_0x1 = uVar8;
          pwVar10 = pwVar10 + 1;
        }
        std::vector<w3StackValue,_std::allocator<w3StackValue>_>::resize
                  ((vector<w3StackValue,_std::allocator<w3StackValue>_> *)&this->super_w3Stack,
                   uVar9 - 1);
        return;
      }
      goto LAB_0011b661;
    }
    pwVar10 = pwVar10 + -1;
  } while( true );
}

Assistant:

INTERP (Rem_s_i64)
{
    const int64_t a = pop_i64 ();
    i64 () %= a;
}